

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,CallOrCast *call)

{
  Allocator *pAVar1;
  CallOrCastBase *pCVar2;
  QualifiedIdentifierResolver *pQVar3;
  bool bVar4;
  Expression *pEVar5;
  QualifiedIdentifier *pQVar6;
  Statement *statementToSearchUpTo;
  size_t sVar7;
  pool_ref<soul::AST::ASTObject> *ppVar8;
  CommaSeparatedList *pCVar9;
  ProcessorBase *pPVar10;
  bool local_26a;
  pool_ref<soul::AST::ASTObject> local_228;
  pool_ptr<soul::AST::ProcessorBase> local_220;
  pool_ptr<soul::AST::ProcessorBase> p_1;
  pool_ptr<soul::AST::ProcessorBase> p;
  pool_ptr<soul::AST::Expression> local_1f8;
  pool_ref<soul::AST::ASTObject> local_1f0;
  pool_ptr<soul::AST::Expression> local_1e8;
  pool_ptr<soul::AST::Expression> e;
  Scope *scope;
  undefined1 local_180 [8];
  NameSearch search;
  undefined1 local_b8 [7];
  bool canResolveProcessorInstance;
  uint local_5c;
  pool_ref<soul::AST::Expression> local_58;
  pool_ptr<soul::AST::QualifiedIdentifier> local_50;
  pool_ptr<soul::AST::QualifiedIdentifier> name;
  Type local_38;
  QualifiedIdentifierResolver *local_20;
  CallOrCast *call_local;
  QualifiedIdentifierResolver *this_local;
  
  local_20 = (QualifiedIdentifierResolver *)call;
  call_local = (CallOrCast *)this;
  bVar4 = pool_ptr<soul::AST::CommaSeparatedList>::operator!=
                    (&(call->super_CallOrCastBase).arguments,(void *)0x0);
  if (bVar4) {
    pCVar9 = pool_ptr<soul::AST::CommaSeparatedList>::operator*
                       (&((CallOrCastBase *)&local_20->super_ModuleInstanceResolver)->arguments);
    RewritingASTVisitor::visitObject((RewritingASTVisitor *)this,&pCVar9->super_Expression);
  }
  bVar4 = AST::CallOrCastBase::areAllArgumentsResolved((CallOrCastBase *)local_20);
  if (!bVar4) {
    return (Expression *)local_20;
  }
  pEVar5 = pool_ref<soul::AST::Expression>::get
                     ((pool_ref<soul::AST::Expression> *)&local_20->currentStatement);
  bVar4 = AST::isResolvedAsType(pEVar5);
  pQVar3 = local_20;
  if (bVar4) {
    pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator;
    pEVar5 = pool_ref<soul::AST::Expression>::operator->
                       ((pool_ref<soul::AST::Expression> *)&local_20->currentStatement);
    (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[5])();
    this_local = (QualifiedIdentifierResolver *)convertToCast(pAVar1,(CallOrCast *)pQVar3,&local_38)
    ;
    Type::~Type(&local_38);
    return (Expression *)this_local;
  }
  local_58.object = ((pool_ref<soul::AST::Expression> *)&local_20->currentStatement)->object;
  cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>((soul *)&local_50,&local_58);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_58);
  bVar4 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
  if (bVar4) {
    pQVar6 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
    bVar4 = AST::QualifiedIdentifier::isSimplePath(pQVar6);
    if (!bVar4) {
      RewritingASTVisitor::replaceExpression
                ((RewritingASTVisitor *)this,
                 (pool_ref<soul::AST::Expression> *)&local_20->currentStatement);
      this_local = local_20;
      local_5c = 1;
      goto LAB_003a1686;
    }
    pQVar6 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
    AST::QualifiedIdentifier::getPath((IdentifierPath *)local_b8,pQVar6);
    bVar4 = IdentifierPath::isQualified((IdentifierPath *)local_b8);
    IdentifierPath::~IdentifierPath((IdentifierPath *)local_b8);
    if (bVar4) {
      RewritingASTVisitor::replaceExpression
                ((RewritingASTVisitor *)this,
                 (pool_ref<soul::AST::Expression> *)&local_20->currentStatement);
    }
    local_26a = true;
    if (this->parsingProcessorInstance == 0) {
      local_26a = pool_ptr<soul::AST::Connection::SharedEndpoint>::operator!=
                            (&this->currentConnectionEndpoint,(void *)0x0);
    }
    search.onlyFindLocalVariables = local_26a;
    AST::Scope::NameSearch::NameSearch((NameSearch *)local_180);
    pQVar6 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
    AST::QualifiedIdentifier::getPath((IdentifierPath *)&scope,pQVar6);
    IdentifierPath::operator=
              ((IdentifierPath *)(search.itemsFound.space + 7),(IdentifierPath *)&scope);
    IdentifierPath::~IdentifierPath((IdentifierPath *)&scope);
    search.partiallyQualifiedPath.pathSections.space[7]._0_1_ = 1;
    search.stopAtFirstScopeWithResults = false;
    search._177_1_ = 1;
    search._178_1_ = 0;
    search._179_1_ = search.onlyFindLocalVariables & 1;
    search.requiredNumFunctionArgs._0_1_ = search.onlyFindLocalVariables & 1;
    search.requiredNumFunctionArgs._1_1_ = 0;
    search.requiredNumFunctionArgs._2_1_ = 0;
    pQVar6 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
    pEVar5 = (Expression *)AST::ASTObject::getParentScope((ASTObject *)pQVar6);
    e.object = pEVar5;
    if (pEVar5 != (Expression *)0x0) {
      statementToSearchUpTo = pool_ptr<soul::AST::Statement>::get(&this->currentStatement);
      AST::Scope::performFullNameSearch
                ((Scope *)pEVar5,(NameSearch *)local_180,statementToSearchUpTo);
    }
    sVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::size
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                       local_180);
    if (sVar7 == 1) {
      ppVar8 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                         ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                          local_180);
      local_1f0.object = ppVar8->object;
      cast<soul::AST::Expression,soul::AST::ASTObject>((soul *)&local_1e8,&local_1f0);
      pool_ref<soul::AST::ASTObject>::~pool_ref(&local_1f0);
      bVar4 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_1e8);
      if (bVar4) {
        local_1f8.object = local_1e8.object;
        bVar4 = AST::isResolvedAsType(&local_1f8);
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1f8);
        if (!bVar4) {
          if ((search.onlyFindLocalVariables & 1U) != 0) {
            pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&local_1e8);
            (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[6])(&p_1);
            bVar4 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&p_1);
            pQVar3 = local_20;
            if (bVar4) {
              pPVar10 = pool_ptr<soul::AST::ProcessorBase>::operator*(&p_1);
              this_local = (QualifiedIdentifierResolver *)
                           resolveProcessorInstance(this,(CallOrCast *)pQVar3,pPVar10);
            }
            local_5c = (uint)bVar4;
            pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&p_1);
            if (local_5c != 0) goto LAB_003a1500;
          }
          goto LAB_003a14f9;
        }
        pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator;
        pCVar2 = (CallOrCastBase *)&local_20->super_ModuleInstanceResolver;
        pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&local_1e8);
        (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[5])(&p);
        pCVar9 = pool_ptr<soul::AST::CommaSeparatedList>::operator*
                           (&((CallOrCastBase *)&local_20->super_ModuleInstanceResolver)->arguments)
        ;
        this_local = (QualifiedIdentifierResolver *)
                     AST::Allocator::
                     allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::AST::CommaSeparatedList&>
                               (pAVar1,&(pCVar2->super_Expression).super_Statement.super_ASTObject.
                                        context,(Type *)&p,pCVar9);
        Type::~Type((Type *)&p);
        local_5c = 1;
      }
      else {
LAB_003a14f9:
        local_5c = 0;
      }
LAB_003a1500:
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1e8);
      if (local_5c == 0) {
        if ((search.onlyFindLocalVariables & 1U) != 0) {
          ppVar8 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                             ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                              local_180);
          local_228.object = ppVar8->object;
          cast<soul::AST::ProcessorBase,soul::AST::ASTObject>((soul *)&local_220,&local_228);
          pool_ref<soul::AST::ASTObject>::~pool_ref(&local_228);
          bVar4 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_220);
          pQVar3 = local_20;
          if (bVar4) {
            pPVar10 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_220);
            this_local = (QualifiedIdentifierResolver *)
                         resolveProcessorInstance(this,(CallOrCast *)pQVar3,pPVar10);
          }
          local_5c = (uint)bVar4;
          pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_220);
          if (local_5c != 0) goto LAB_003a1642;
        }
        goto LAB_003a163b;
      }
    }
    else {
LAB_003a163b:
      local_5c = 0;
    }
LAB_003a1642:
    AST::Scope::NameSearch::~NameSearch((NameSearch *)local_180);
    if (local_5c != 0) goto LAB_003a1686;
  }
  else {
    RewritingASTVisitor::replaceExpression
              ((RewritingASTVisitor *)this,
               (pool_ref<soul::AST::Expression> *)&local_20->currentStatement);
  }
  local_5c = 0;
LAB_003a1686:
  pool_ptr<soul::AST::QualifiedIdentifier>::~pool_ptr(&local_50);
  if (local_5c == 0) {
    return (Expression *)local_20;
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            if (call.arguments != nullptr)
                visitObject (*call.arguments);

            if (call.areAllArgumentsResolved())
            {
                if (AST::isResolvedAsType (call.nameOrType.get()))
                    return convertToCast (allocator, call, call.nameOrType->resolveAsType());

                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (! name->isSimplePath())
                    {
                        replaceExpression (call.nameOrType);
                        return call;
                    }

                    if (name->getPath().isQualified())
                        replaceExpression (call.nameOrType);

                    bool canResolveProcessorInstance = (parsingProcessorInstance != 0 || currentConnectionEndpoint != nullptr);

                    AST::Scope::NameSearch search;
                    search.partiallyQualifiedPath = name->getPath();
                    search.stopAtFirstScopeWithResults = true;
                    search.findVariables = false;
                    search.findTypes = true;
                    search.findFunctions = false;
                    search.findNamespaces = canResolveProcessorInstance;
                    search.findProcessors = canResolveProcessorInstance;
                    search.findProcessorInstances = false;
                    search.findEndpoints = false;

                    if (auto scope = name->getParentScope())
                        scope->performFullNameSearch (search, currentStatement.get());

                    if (search.itemsFound.size() == 1)
                    {
                        if (auto e = cast<AST::Expression> (search.itemsFound.front()))
                        {
                            if (AST::isResolvedAsType (e))
                                return allocator.allocate<AST::TypeCast> (call.context, e->resolveAsType(), *call.arguments);

                            if (canResolveProcessorInstance)
                                if (auto p = e->getAsProcessor())
                                    return resolveProcessorInstance (call, *p);
                        }

                        if (canResolveProcessorInstance)
                            if (auto p = cast<AST::ProcessorBase> (search.itemsFound.front()))
                                return resolveProcessorInstance (call, *p);
                    }
                }
                else
                {
                    replaceExpression (call.nameOrType);
                }
            }

            return call;
        }